

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReshapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshape(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 300) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 300;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReshapeLayerParams::ReshapeLayerParams(this_00.reshape_);
    (this->layer_).reshape_ = (ReshapeLayerParams *)this_00;
  }
  return (ReshapeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeLayerParams* NeuralNetworkLayer::mutable_reshape() {
  if (!has_reshape()) {
    clear_layer();
    set_has_reshape();
    layer_.reshape_ = new ::CoreML::Specification::ReshapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshape)
  return layer_.reshape_;
}